

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::PaddingLayerParams::SerializeWithCachedSizes
          (PaddingLayerParams *this,CodedOutputStream *output)

{
  if (this->_oneof_case_[0] == 1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&((this->PaddingType_).constant_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 2) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&((this->PaddingType_).constant_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 3) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&((this->PaddingType_).constant_)->super_MessageLite,output);
  }
  if (this->paddingamounts_ != (BorderAmounts *)0x0 &&
      this != (PaddingLayerParams *)&_PaddingLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (10,&this->paddingamounts_->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void PaddingLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.PaddingLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.PaddingLayerParams.PaddingConstant constant = 1;
  if (has_constant()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *PaddingType_.constant_, output);
  }

  // .CoreML.Specification.PaddingLayerParams.PaddingReflection reflection = 2;
  if (has_reflection()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *PaddingType_.reflection_, output);
  }

  // .CoreML.Specification.PaddingLayerParams.PaddingReplication replication = 3;
  if (has_replication()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *PaddingType_.replication_, output);
  }

  // .CoreML.Specification.BorderAmounts paddingAmounts = 10;
  if (this->has_paddingamounts()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, *this->paddingamounts_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.PaddingLayerParams)
}